

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::ProducerIPCClientImpl::NotifyDataSourceStopped
          (ProducerIPCClientImpl *this,DataSourceInstanceID id)

{
  NotifyDataSourceStoppedRequest req;
  _Any_data local_98;
  code *local_88;
  undefined8 uStack_80;
  DeferredBase local_70;
  NotifyDataSourceStoppedRequest local_50;
  
  if (this->connected_ == true) {
    protos::gen::NotifyDataSourceStoppedRequest::NotifyDataSourceStoppedRequest(&local_50);
    local_50._has_field_.super__Base_bitset<1UL>._M_w._0_1_ =
         (byte)local_50._has_field_.super__Base_bitset<1UL>._M_w | 2;
    local_98._M_unused._M_object = (void *)0x0;
    local_98._8_8_ = 0;
    local_88 = (code *)0x0;
    uStack_80 = 0;
    local_50.data_source_id_ = id;
    ipc::Deferred<perfetto::protos::gen::NotifyDataSourceStoppedResponse>::Deferred
              ((Deferred<perfetto::protos::gen::NotifyDataSourceStoppedResponse> *)&local_70,
               (function<void_(perfetto::ipc::AsyncResult<perfetto::protos::gen::NotifyDataSourceStoppedResponse>)>
                *)&local_98);
    protos::gen::ProducerPortProxy::NotifyDataSourceStopped
              (&this->producer_port_,&local_50,(DeferredNotifyDataSourceStoppedResponse *)&local_70,
               -1);
    ipc::DeferredBase::~DeferredBase(&local_70);
    if (local_88 != (code *)0x0) {
      (*local_88)((_Any_data *)&local_98,(_Any_data *)&local_98,__destroy_functor);
    }
    protos::gen::NotifyDataSourceStoppedRequest::~NotifyDataSourceStoppedRequest(&local_50);
  }
  return;
}

Assistant:

void ProducerIPCClientImpl::NotifyDataSourceStopped(DataSourceInstanceID id) {
  PERFETTO_DCHECK_THREAD(thread_checker_);
  if (!connected_) {
    PERFETTO_DLOG(
        "Cannot NotifyDataSourceStopped(), not connected to tracing service");
    return;
  }
  protos::gen::NotifyDataSourceStoppedRequest req;
  req.set_data_source_id(id);
  producer_port_.NotifyDataSourceStopped(
      req, ipc::Deferred<protos::gen::NotifyDataSourceStoppedResponse>());
}